

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QTextTableCell adjacentCell(QTextTable *table,QTextTableCell *cell,Edge edge)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined8 extraout_RDX;
  QTextTableCell *in_RDI;
  QTextTableCell QVar5;
  int row;
  int col;
  int dr;
  int dc;
  QTextTable *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QTextTableCell *this;
  int local_24;
  int local_20;
  undefined8 uVar4;
  
  local_20 = 0;
  local_24 = 0;
  this = in_RDI;
  switch(in_ECX) {
  case 0:
    local_24 = -1;
    break;
  case 1:
    local_20 = QTextTableCell::columnSpan
                         ((QTextTableCell *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    break;
  case 2:
    local_24 = QTextTableCell::rowSpan
                         ((QTextTableCell *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    break;
  case 3:
    local_20 = -1;
  }
  iVar1 = QTextTableCell::column
                    ((QTextTableCell *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                    );
  iVar1 = iVar1 + local_20;
  iVar2 = QTextTableCell::row((QTextTableCell *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar2 = iVar2 + local_24;
  if ((((iVar1 < 0) || (iVar2 < 0)) ||
      (iVar3 = QTextTable::columns(in_stack_ffffffffffffffa0), iVar3 <= iVar1)) ||
     (iVar3 = QTextTable::rows(in_stack_ffffffffffffffa0), iVar3 <= iVar2)) {
    QTextTableCell::QTextTableCell(this);
    uVar4 = extraout_RDX;
  }
  else {
    iVar3 = QTextTableCell::row((QTextTableCell *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QTextTableCell::column((QTextTableCell *)CONCAT44(iVar3 + local_24,in_stack_ffffffffffffffa8));
    QVar5 = QTextTable::cellAt((QTextTable *)this,iVar1,iVar2);
    uVar4 = QVar5._8_8_;
  }
  QVar5._8_8_ = uVar4;
  QVar5.table = (QTextTable *)in_RDI;
  return QVar5;
}

Assistant:

static inline QTextTableCell adjacentCell(QTextTable *table, const QTextTableCell &cell,
                                          QCss::Edge edge)
{
    int dc = 0;
    int dr = 0;

    switch (edge) {
    case QCss::LeftEdge:
        dc = -1;
        break;
    case QCss::RightEdge:
        dc = cell.columnSpan();
        break;
    case QCss::TopEdge:
        dr = -1;
        break;
    case QCss::BottomEdge:
        dr = cell.rowSpan();
        break;
    default:
        Q_UNREACHABLE();
        break;
    }

    // get sibling cell
    int col = cell.column() + dc;
    int row = cell.row() + dr;

    if (col < 0 || row < 0 || col >= table->columns() || row >= table->rows())
        return QTextTableCell();
    else
        return table->cellAt(cell.row() + dr, cell.column() + dc);
}